

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::ParsedIR::get_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  _Node_iterator_base<unsigned_int,_false> _Var3;
  ulong uVar4;
  BuiltIn BVar5;
  key_type local_24;
  
  pMVar2 = find_meta(this,(ID)id.id);
  BVar5 = BuiltInPosition;
  if ((pMVar2 != (Meta *)0x0) &&
     (uVar4 = (ulong)index, BVar5 = BuiltInPosition,
     uVar4 < (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size)) {
    pDVar1 = (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      _Var3._M_cur = (__node_type *)
                     (pDVar1[uVar4].decoration_flags.lower >> ((ulong)decoration & 0x3f) & 1);
    }
    else {
      _Var3._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&pDVar1[uVar4].decoration_flags.higher._M_h,&local_24);
    }
    if (_Var3._M_cur != (__node_type *)0x0) {
      BVar5 = BuiltInPointSize;
      if ((int)decoration < 0x1d) {
        if (decoration == DecorationSpecId) {
          BVar5 = pDVar1[uVar4].spec_id;
        }
        else if (decoration == DecorationMatrixStride) {
          BVar5 = pDVar1[uVar4].matrix_stride;
        }
        else if (decoration == DecorationBuiltIn) {
          BVar5 = pDVar1[uVar4].builtin_type;
        }
      }
      else {
        switch(decoration) {
        case DecorationStream:
          BVar5 = pDVar1[uVar4].stream;
          break;
        case DecorationLocation:
          BVar5 = pDVar1[uVar4].location;
          break;
        case DecorationComponent:
          BVar5 = pDVar1[uVar4].component;
          break;
        case DecorationIndex:
          BVar5 = pDVar1[uVar4].index;
          break;
        case DecorationBinding:
          BVar5 = pDVar1[uVar4].binding;
          break;
        case DecorationOffset:
          BVar5 = pDVar1[uVar4].offset;
          break;
        case DecorationXfbBuffer:
          BVar5 = pDVar1[uVar4].xfb_buffer;
          break;
        case DecorationXfbStride:
          BVar5 = pDVar1[uVar4].xfb_stride;
        }
      }
    }
  }
  return BVar5;
}

Assistant:

uint32_t ParsedIR::get_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationBinding:
		return dec.binding;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationMatrixStride:
		return dec.matrix_stride;
	case DecorationIndex:
		return dec.index;
	default:
		return 1;
	}
}